

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  pointer puVar1;
  pointer puVar2;
  TestSpecParser *pTVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  TestSpecParser *local_68;
  ulong local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = this;
  subString_abi_cxx11_(&token,this);
  pTVar3 = local_68;
  lVar6 = 1;
  uVar5 = 0;
  while( true ) {
    puVar1 = (pTVar3->m_escapeChars).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (pTVar3->m_escapeChars).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= uVar5) break;
    std::__cxx11::string::substr((ulong)&local_88,(ulong)&token);
    local_60 = uVar5;
    local_58 = lVar6;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&token);
    std::operator+(&local_c8,&local_88,&local_50);
    std::__cxx11::string::operator=((string *)&token,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    uVar5 = local_60 + 1;
    lVar6 = local_58 + -1;
  }
  if (puVar2 != puVar1) {
    (pTVar3->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::__cxx11::string::string((string *)&local_c8,"exclude:",(allocator *)&local_88);
  bVar4 = startsWith(&token,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar4) {
    pTVar3->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)&token);
    std::__cxx11::string::operator=((string *)&token,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if (token._M_string_length != 0) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&>(&local_88);
    local_c8._M_dataplus._M_p = local_88._M_dataplus._M_p;
    local_c8._M_string_length = local_88._M_string_length;
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    if (pTVar3->m_exclusion == true) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)&local_88);
      std::__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Catch::TestSpec::Pattern,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
                 (__shared_ptr<Catch::TestSpec::ExcludedPattern,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_88);
      clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(pTVar3->m_currentFilter).m_patterns,(value_type *)&local_c8);
    clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
  }
  pTVar3->m_exclusion = false;
  pTVar3->m_mode = None;
  std::__cxx11::string::~string((string *)&token);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( std::size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                TestSpec::PatternPtr pattern = std::make_shared<T>( token );
                if( m_exclusion )
                    pattern = std::make_shared<TestSpec::ExcludedPattern>( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }